

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

EulerAngles *
AML::quat2EulerAngles(EulerAngles *__return_storage_ptr__,Quaternion *quat,EulerSequence seq)

{
  bool bVar1;
  double TOL;
  EulerSequence seq_local;
  Quaternion *quat_local;
  
  bVar1 = isUnitQuat(quat,0.0001);
  if (bVar1) {
    switch(seq) {
    case ZXZ:
      quat2EulerAngles_ZXZ(__return_storage_ptr__,quat);
      break;
    case XYX:
      quat2EulerAngles_XYX(__return_storage_ptr__,quat);
      break;
    case YZY:
      quat2EulerAngles_YZY(__return_storage_ptr__,quat);
      break;
    case ZYZ:
      quat2EulerAngles_ZYZ(__return_storage_ptr__,quat);
      break;
    case XZX:
      quat2EulerAngles_XZX(__return_storage_ptr__,quat);
      break;
    case YXY:
      quat2EulerAngles_YXY(__return_storage_ptr__,quat);
      break;
    case XYZ:
      quat2EulerAngles_XYZ(__return_storage_ptr__,quat);
      break;
    case YZX:
      quat2EulerAngles_YZX(__return_storage_ptr__,quat);
      break;
    case ZXY:
      quat2EulerAngles_ZXY(__return_storage_ptr__,quat);
      break;
    case XZY:
      quat2EulerAngles_XZY(__return_storage_ptr__,quat);
      break;
    case ZYX:
      quat2EulerAngles_ZYX(__return_storage_ptr__,quat);
      break;
    case YXZ:
      quat2EulerAngles_YXZ(__return_storage_ptr__,quat);
      break;
    default:
      goto switchD_001094c1_default;
    }
  }
  else {
switchD_001094c1_default:
    EulerAngles::EulerAngles(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles quat2EulerAngles(const Quaternion& quat, const EulerAngles::EulerSequence seq)
    {
        const double TOL = 0.0001;

        // Check for valid Quat
        if (isUnitQuat(quat, TOL))
        {
            switch (seq)
            {
            case EulerAngles::EulerSequence::XYZ:
                return quat2EulerAngles_XYZ(quat);
            case EulerAngles::EulerSequence::ZXZ:
                return quat2EulerAngles_ZXZ(quat);
            case EulerAngles::EulerSequence::XYX:
                return quat2EulerAngles_XYX(quat);
            case EulerAngles::EulerSequence::YZY:
                return quat2EulerAngles_YZY(quat);
            case EulerAngles::EulerSequence::ZYZ:
                return quat2EulerAngles_ZYZ(quat);
            case EulerAngles::EulerSequence::XZX:
                return quat2EulerAngles_XZX(quat);
            case EulerAngles::EulerSequence::YXY:
                return quat2EulerAngles_YXY(quat);
            case EulerAngles::EulerSequence::YZX:
                return quat2EulerAngles_YZX(quat);
            case EulerAngles::EulerSequence::ZXY:
                return quat2EulerAngles_ZXY(quat);
            case EulerAngles::EulerSequence::XZY:
                return quat2EulerAngles_XZY(quat);
            case EulerAngles::EulerSequence::ZYX:
                return quat2EulerAngles_ZYX(quat);
            case EulerAngles::EulerSequence::YXZ:
                return quat2EulerAngles_YXZ(quat);
            }
        }
        return EulerAngles();
    }